

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pBlendTests.cpp
# Opt level: O0

int __thiscall deqp::gles2::Performance::BlendTests::init(BlendTests *this,EVP_PKEY_CTX *ctx)

{
  BlendCase *this_00;
  long lVar1;
  BlendTests *pBVar2;
  uint local_1c;
  int caseNdx;
  BlendTests *this_local;
  
  local_1c = 0;
  pBVar2 = this;
  while ((int)local_1c < 0xd) {
    this_00 = (BlendCase *)operator_new(0x1d8);
    lVar1 = (long)(int)local_1c;
    BlendCase::BlendCase
              (this_00,(this->super_TestCaseGroup).m_context,init::cases[lVar1].name,"",
               init::cases[lVar1].modeRGB,init::cases[lVar1].modeAlpha,init::cases[lVar1].srcRGB,
               init::cases[lVar1].dstRGB,init::cases[lVar1].srcAlpha,init::cases[lVar1].dstAlpha);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    local_1c = local_1c + 1;
    pBVar2 = (BlendTests *)(ulong)local_1c;
  }
  return (int)pBVar2;
}

Assistant:

void BlendTests::init (void)
{
	static const struct
	{
		const char*	name;
		GLenum		modeRGB;
		GLenum		modeAlpha;
		GLenum		srcRGB;
		GLenum		dstRGB;
		GLenum		srcAlpha;
		GLenum		dstAlpha;
	} cases[] =
	{
		// Single blend func, factor one.
		{ "add",						GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ONE,		GL_ONE,		GL_ONE,		GL_ONE		},
		{ "subtract",					GL_FUNC_SUBTRACT,			GL_FUNC_SUBTRACT,			GL_ONE,		GL_ONE,		GL_ONE,		GL_ONE		},
		{ "reverse_subtract",			GL_FUNC_REVERSE_SUBTRACT,	GL_FUNC_REVERSE_SUBTRACT,	GL_ONE,		GL_ONE,		GL_ONE,		GL_ONE		},

		// Porter-duff modes that can be implemented.
		{ "dst_atop",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ONE_MINUS_DST_ALPHA,		GL_SRC_ALPHA,				GL_ONE,					GL_ZERO					},
		{ "dst_in",						GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ZERO,					GL_SRC_ALPHA,				GL_ZERO,				GL_SRC_ALPHA			},
		{ "dst_out",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ZERO,					GL_ONE_MINUS_SRC_ALPHA,		GL_ZERO,				GL_ONE_MINUS_SRC_ALPHA	},
		{ "dst_over",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ONE_MINUS_DST_ALPHA,		GL_ONE,						GL_ONE,					GL_ONE_MINUS_SRC_ALPHA	},
		{ "src_atop",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_DST_ALPHA,				GL_ONE_MINUS_SRC_ALPHA,		GL_ZERO,				GL_ONE					},
		{ "src_in",						GL_FUNC_ADD,				GL_FUNC_ADD,				GL_DST_ALPHA,				GL_ZERO,					GL_DST_ALPHA,			GL_ZERO					},
		{ "src_out",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ONE_MINUS_DST_ALPHA,		GL_ZERO,					GL_ONE_MINUS_DST_ALPHA,	GL_ZERO					},
		{ "src_over",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ONE,						GL_ONE_MINUS_SRC_ALPHA,		GL_ONE,					GL_ONE_MINUS_SRC_ALPHA	},
		{ "multiply",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_DST_COLOR,				GL_ZERO,					GL_DST_ALPHA,			GL_ZERO					},
		{ "screen",						GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ONE,						GL_ONE_MINUS_SRC_COLOR,		GL_ONE,					GL_ONE_MINUS_SRC_ALPHA	}
	};

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
		addChild(new BlendCase(m_context, cases[caseNdx].name, "", cases[caseNdx].modeRGB, cases[caseNdx].modeAlpha, cases[caseNdx].srcRGB, cases[caseNdx].dstRGB, cases[caseNdx].srcAlpha, cases[caseNdx].dstAlpha));
}